

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawList *this;
  ulong uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  value_type *pvVar8;
  char *pcVar9;
  char *pcVar10;
  ImDrawCmd *pIVar11;
  unsigned_short *puVar12;
  ulong uVar13;
  uint uVar14;
  ImDrawCmd *pIVar15;
  long lVar16;
  int iVar17;
  int local_1e4;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangles_pos [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar9 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar9 = draw_list->_OwnerName;
  }
  iVar17 = (draw_list->CmdBuffer).Size;
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar9,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar17);
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x36;
    buf[5] = -0x38;
    buf[6] = -0x38;
    buf[7] = '>';
    buf[8] = -0x36;
    buf[9] = -0x38;
    buf[10] = -0x38;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (bVar4) {
      TreePop();
      return;
    }
  }
  else {
    this = &pIVar3->OverlayDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar5 = IsItemHovered(0), bVar5)) {
      buf._0_4_ = (window->Size).x + (window->Pos).x;
      buf._4_4_ = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
    }
    if (bVar4) {
      pIVar11 = (draw_list->CmdBuffer).Data;
      local_1e4 = 0;
      for (pIVar15 = pIVar11; pIVar15 < pIVar11 + (draw_list->CmdBuffer).Size; pIVar15 = pIVar15 + 1
          ) {
        if (pIVar15->UserCallback == (ImDrawCallback)0x0) {
          uVar14 = pIVar15->ElemCount;
          if (uVar14 != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              pcVar9 = "non-indexed";
              puVar12 = (unsigned_short *)0x0;
            }
            else {
              puVar12 = (draw_list->IdxBuffer).Data;
              pcVar9 = "indexed";
            }
            bVar4 = TreeNode((void *)(((long)pIVar15 - (long)pIVar11) / 0x30),
                             "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                             SUB84((double)(pIVar15->ClipRect).x,0),(double)(pIVar15->ClipRect).y,
                             (double)(pIVar15->ClipRect).z,(double)(pIVar15->ClipRect).w,
                             (ulong)uVar14,pcVar9,pIVar15->TextureId,(ulong)uVar14,iVar17);
            if ((show_draw_cmd_clip_rects == true) && (bVar5 = IsItemHovered(0), bVar5)) {
              buf._0_8_ = *(undefined8 *)&pIVar15->ClipRect;
              buf._8_8_ = *(undefined8 *)&(pIVar15->ClipRect).z;
              clipper.StartPosY = 3.4028235e+38;
              clipper.ItemsHeight = 3.4028235e+38;
              clipper.ItemsCount = -0x800001;
              clipper.StepNo = -0x800001;
              for (lVar16 = (long)local_1e4;
                  lVar16 < (long)(int)pIVar15->ElemCount + (long)local_1e4; lVar16 = lVar16 + 1) {
                if (puVar12 == (unsigned_short *)0x0) {
                  uVar14 = (uint)lVar16;
                }
                else {
                  uVar14 = (uint)puVar12[lVar16];
                }
                pvVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
                ImRect::Add((ImRect *)&clipper,&pvVar8->pos);
              }
              ImRect::Floor((ImRect *)buf);
              ImDrawList::AddRect(this,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff00ffff,0.0,0xf,1.0);
              ImRect::Floor((ImRect *)&clipper);
              ImDrawList::AddRect(this,(ImVec2 *)&clipper,(ImVec2 *)&clipper.ItemsCount,0xffff00ff,
                                  0.0,0xf,1.0);
            }
            if (bVar4) {
              uVar14 = pIVar15->ElemCount;
              clipper.StartPosY = GetCursorPosY();
              clipper.ItemsHeight = -1.0;
              clipper.StepNo = 0;
              clipper.DisplayStart = -1;
              clipper.DisplayEnd = -1;
              clipper.ItemsCount = uVar14 / 3;
              while (bVar4 = ImGuiListClipper::Step(&clipper), bVar4) {
                uVar13 = (ulong)(uint)(clipper.DisplayStart * 3 + local_1e4);
                for (iVar7 = clipper.DisplayStart; iVar7 < clipper.DisplayEnd; iVar7 = iVar7 + 1) {
                  triangles_pos[0].x = 0.0;
                  triangles_pos[0].y = 0.0;
                  triangles_pos[1].x = 0.0;
                  triangles_pos[1].y = 0.0;
                  triangles_pos[2].x = 0.0;
                  triangles_pos[2].y = 0.0;
                  pcVar9 = buf;
                  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                    uVar1 = lVar16 + (uVar13 & 0xffffffff);
                    if (puVar12 == (unsigned_short *)0x0) {
                      uVar14 = (uint)uVar1;
                    }
                    else {
                      uVar14 = (uint)puVar12[(int)uVar13 + lVar16];
                    }
                    pvVar8 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
                    triangles_pos[lVar16] = pvVar8->pos;
                    pcVar10 = "   ";
                    if (lVar16 == 0) {
                      pcVar10 = "vtx";
                    }
                    iVar6 = ImFormatString(pcVar9,(long)((int)local_3c - (int)pcVar9),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           SUB84((double)(pvVar8->pos).x,0),(double)(pvVar8->pos).y,
                                           (double)(pvVar8->uv).x,(double)(pvVar8->uv).y,pcVar10,
                                           uVar1 & 0xffffffff,(ulong)pvVar8->col);
                    pcVar9 = pcVar9 + iVar6;
                  }
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable(buf,false,0,&local_190);
                  bVar4 = IsItemHovered(0);
                  if (bVar4) {
                    uVar14 = (pIVar3->OverlayDrawList).Flags;
                    (pIVar3->OverlayDrawList).Flags = uVar14 & 0xfffffffe;
                    ImDrawList::AddPolyline(this,triangles_pos,3,0xff00ffff,true,1.0);
                    (pIVar3->OverlayDrawList).Flags = uVar14;
                  }
                  uVar13 = (uVar13 & 0xffffffff) + 3;
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper(&clipper);
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar15->UserCallback,pIVar15->UserCallbackData);
        }
        local_1e4 = local_1e4 + pIVar15->ElemCount;
        pIVar11 = (draw_list->CmdBuffer).Data;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }

                ImDrawList* overlay_draw_list = GetOverlayDrawList(); // Render additional visuals into the top-most draw list
                if (window && IsItemHovered())
                    overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
                if (!node_open)
                    return;

                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                        continue;
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;

                    // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300];
                            char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                            {
                                ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                                overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                                overlay_draw_list->Flags = backup_flags;
                            }
                        }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }